

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.h
# Opt level: O3

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clone(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *pcVar1;
  undefined8 *puVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  uint *puVar5;
  byte bVar6;
  
  bVar6 = 0;
  puVar2 = (undefined8 *)operator_new(0xb0);
  pcVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_name;
  puVar2[1] = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
  puVar2[2] = pcVar1;
  *(Type *)(puVar2 + 3) =
       (this->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_type;
  pnVar4 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta;
  puVar5 = (uint *)((long)puVar2 + 0x1c);
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -8 + 4);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  *(int *)((long)puVar2 + 0x8c) =
       (this->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta.m_backend.exp;
  *(bool *)(puVar2 + 0x12) =
       (this->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta.m_backend.neg;
  *(undefined8 *)((long)puVar2 + 0x94) =
       *(undefined8 *)
        &(this->
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).delta.m_backend.fpclass;
  puVar2[0x14] = 0;
  puVar2[0x15] = 0;
  *puVar2 = &PTR_getName_006a8a18;
  return (int)puVar2;
}

Assistant:

inline virtual SPxRatioTester<R>* clone() const
   {
      return new SPxHarrisRT(*this);
   }